

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cc
# Opt level: O3

void __thiscall p2t::Triangle::Clear(Triangle *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = 4;
  do {
    lVar1 = *(long *)(this->constrained_edge + lVar2 * 8);
    if (lVar1 != 0) {
      lVar3 = (ulong)(*(Triangle **)(lVar1 + 0x28) != this) * 8 + 0x28;
      if (*(Triangle **)(lVar1 + 0x20) == this) {
        lVar3 = 0x20;
      }
      *(undefined8 *)(lVar1 + lVar3) = 0;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 7);
  this->neighbors_[1] = (Triangle *)0x0;
  this->neighbors_[2] = (Triangle *)0x0;
  this->points_[2] = (Point *)0x0;
  this->neighbors_[0] = (Triangle *)0x0;
  this->points_[0] = (Point *)0x0;
  this->points_[1] = (Point *)0x0;
  return;
}

Assistant:

void Triangle::Clear()
{
    Triangle *t;
    for( int i=0; i<3; i++ )
    {
        t = neighbors_[i];
        if( t != NULL )
        {
            t->ClearNeighbor( this );
        }
    }
    ClearNeighbors();
    points_[0]=points_[1]=points_[2] = NULL;
}